

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::InputFile::Data::copyCachedBuffer
          (Data *this,ConstIterator to,ConstIterator from,int scanline1,int scanline2,int yStart,
          int xStart,int width)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ArgExc *this_00;
  long lVar8;
  long lVar9;
  undefined4 *puVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  if ((*(int *)((long)to._i._M_node + 0x140) == 1) && (*(int *)((long)to._i._M_node + 0x144) == 1))
  {
    if ((*(int *)((long)from._i._M_node + 0x140) == 1) &&
       (*(int *)((long)from._i._M_node + 0x144) == 1)) {
      if (((*(byte *)((long)from._i._M_node + 0x150) & 1) == 0) &&
         ((*(byte *)((long)from._i._M_node + 0x151) & 1) != 0)) {
        if (*(int *)((long)to._i._M_node + 0x120) == *(int *)((long)from._i._M_node + 0x120)) {
          lVar2 = *(long *)((long)to._i._M_node + 0x128);
          lVar3 = *(long *)((long)to._i._M_node + 0x130);
          lVar4 = *(long *)((long)to._i._M_node + 0x138);
          bVar1 = *(byte *)((long)to._i._M_node + 0x151);
          lVar5 = *(long *)((long)from._i._M_node + 0x128);
          lVar6 = *(long *)((long)from._i._M_node + 0x130);
          lVar7 = *(long *)((long)from._i._M_node + 0x138);
          if ((lVar6 == 2) || (lVar6 == 4)) {
            lVar13 = (long)xStart;
            lVar9 = 0;
            if ((*(byte *)((long)to._i._M_node + 0x150) & 1) == 0) {
              lVar9 = lVar3 * lVar13;
            }
            if (width < 1) {
              width = 0;
            }
            for (lVar8 = (long)scanline1; lVar8 <= scanline2; lVar8 = lVar8 + 1) {
              if ((bVar1 & 1) == 0) {
                lVar12 = lVar8 - yStart;
                lVar11 = lVar8;
              }
              else {
                lVar12 = lVar8 - yStart;
                lVar11 = lVar12;
              }
              lVar12 = lVar12 * lVar7 + lVar5;
              puVar10 = (undefined4 *)(lVar11 * lVar4 + lVar2 + lVar9);
              if (lVar6 == 2) {
                for (lVar11 = 0; width != (int)lVar11; lVar11 = lVar11 + 1) {
                  *(undefined2 *)puVar10 = *(undefined2 *)(lVar12 + lVar13 * 2 + lVar11 * 2);
                  puVar10 = (undefined4 *)((long)puVar10 + lVar3);
                }
              }
              else {
                for (lVar11 = 0; width != (int)lVar11; lVar11 = lVar11 + 1) {
                  *puVar10 = *(undefined4 *)(lVar12 + lVar13 * 4 + lVar11 * 4);
                  puVar10 = (undefined4 *)((long)puVar10 + lVar3);
                }
              }
            }
            return;
          }
          this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_00,"Unhandled type in copying tile cache slice.");
        }
        else {
          this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(this_00,"Invalid type mismatch in slice from setFrameBuffer.");
        }
      }
      else {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc
                  (this_00,"Invalid expectation around tile coords flags from setFrameBuffer.");
      }
    }
    else {
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
    }
  }
  else {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,"Tiled data should not have subsampling.");
  }
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
InputFile::Data::copyCachedBuffer (FrameBuffer::ConstIterator to,
                                   FrameBuffer::ConstIterator from,
                                   int scanline1, int scanline2,
                                   int yStart, int xStart, int width)
{
    Slice toSlice = to.slice ();
    if (toSlice.xSampling != 1 || toSlice.ySampling != 1)
        throw IEX_NAMESPACE::ArgExc ("Tiled data should not have subsampling.");
    Slice fromSlice = from.slice ();
    if (fromSlice.xSampling != 1 || fromSlice.ySampling != 1)
        throw IEX_NAMESPACE::ArgExc ("Tiled data should not have subsampling.");
    if (fromSlice.xTileCoords || !fromSlice.yTileCoords)
        throw IEX_NAMESPACE::ArgExc ("Invalid expectation around tile coords flags from setFrameBuffer.");

    if (toSlice.type != fromSlice.type)
        throw IEX_NAMESPACE::ArgExc ("Invalid type mismatch in slice from setFrameBuffer.");
    if (fromSlice.xStride != 2 && fromSlice.xStride != 4)
        throw IEX_NAMESPACE::ArgExc ("Unhandled type in copying tile cache slice.");

    for (int y = scanline1; y <= scanline2; ++y)
    {
        char* toPtr = toSlice.base;
        const char* fromPtr = fromSlice.base;

        if (toSlice.yTileCoords)
            toPtr += ( int64_t (y) - int64_t (yStart) ) * toSlice.yStride;
        else
            toPtr += int64_t (y) * toSlice.yStride;
        if (!toSlice.xTileCoords)
            toPtr += int64_t (xStart) * toSlice.xStride;

        fromPtr += ( int64_t (y) - int64_t (yStart) ) * fromSlice.yStride;
        if (fromSlice.xStride == 2)
        {
            fromPtr += int64_t (xStart) * 2;
            for (int x = 0; x < width; ++x)
            {
                *reinterpret_cast<uint16_t*> (toPtr) =
                    *reinterpret_cast<const uint16_t*> (fromPtr);
                toPtr += toSlice.xStride;
                fromPtr += 2;
            }
        }
        else
        {
            fromPtr += int64_t (xStart) * 4;
            for (int x = 0; x < width; ++x)
            {
                *reinterpret_cast<uint32_t*> (toPtr) =
                    *reinterpret_cast<const uint32_t*> (fromPtr);
                toPtr += toSlice.xStride;
                fromPtr += 4;
            }
        }
    }
}